

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singleton.h
# Opt level: O0

void es::init::static_obj_stack<es::init::singletons_meta_data>::push(singletons_meta_data *p)

{
  sequenced_ptr<es::init::singletons_meta_data> new_value;
  sequenced_ptr<es::init::singletons_meta_data> expected_value;
  bool bVar1;
  undefined8 extraout_RDX;
  undefined8 *in_RDI;
  sequenced_ptr<es::init::singletons_meta_data> new_top;
  sequenced_ptr<es::init::singletons_meta_data> stack_top;
  sequenced_ptr<es::init::singletons_meta_data> *in_stack_ffffffffffffffb8;
  
  do {
    in_stack_ffffffffffffffb8 =
         sequenced_ptr<es::init::singletons_meta_data>::load(in_stack_ffffffffffffffb8);
    *in_RDI = in_stack_ffffffffffffffb8;
    expected_value._u._s._seq = (uint64_t)in_RDI;
    expected_value._u._s._p = (singletons_meta_data *)extraout_RDX;
    new_value._u._s._seq = (uint64_t)in_stack_ffffffffffffffb8;
    new_value._u._s._p = (singletons_meta_data *)extraout_RDX;
    bVar1 = sequenced_ptr<es::init::singletons_meta_data>::cas
                      (in_stack_ffffffffffffffb8,expected_value,new_value);
  } while (((bVar1 ^ 0xffU) & 1) != 0);
  return;
}

Assistant:

static void push(T* p)
    {
        sequenced_ptr<T> stack_top;
        sequenced_ptr<T> new_top;
        do
        {
            stack_top = top.load();
            new_top   = stack_top;

            p->_next         = stack_top._u._s._p;
            new_top._u._s._p = p;
            ++new_top._u._s._seq;
        } while (!top.cas(stack_top, new_top));
    }